

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chrometracer.h
# Opt level: O0

void __thiscall
CChromeTracer::addQueueMetadata(CChromeTracer *this,uint32_t queueNumber,string *queueName)

{
  ostream *poVar1;
  string *in_RDX;
  uint in_ESI;
  long in_RDI;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffff68;
  lock_guard<std::mutex> *in_stack_ffffffffffffff70;
  
  std::lock_guard<std::mutex>::lock_guard(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  poVar1 = std::operator<<((ostream *)(in_RDI + 0x40),
                           "{\"ph\":\"M\",\"name\":\"thread_name\",\"pid\":");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(ulong *)(in_RDI + 0x30));
  poVar1 = std::operator<<(poVar1,",\"tid\":");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_ESI);
  poVar1 = std::operator<<(poVar1,".1,\"args\":{\"name\":\"");
  poVar1 = std::operator<<(poVar1,in_RDX);
  std::operator<<(poVar1,"\"}},\n");
  poVar1 = std::operator<<((ostream *)(in_RDI + 0x40),
                           "{\"ph\":\"M\",\"name\":\"thread_sort_index\",\"pid\":");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(ulong *)(in_RDI + 0x30));
  poVar1 = std::operator<<(poVar1,",\"tid\":");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_ESI);
  poVar1 = std::operator<<(poVar1,".1,\"args\":{\"sort_index\":\"");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_ESI);
  std::operator<<(poVar1,"\"}},\n");
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x22b780);
  return;
}

Assistant:

void addQueueMetadata(
            uint32_t queueNumber,
            const std::string& queueName )
    {
        std::lock_guard<std::mutex> lock(m_Mutex);
        m_TraceFile
            << "{\"ph\":\"M\",\"name\":\"thread_name\",\"pid\":" << m_ProcessId
            << ",\"tid\":" << queueNumber
            << ".1,\"args\":{\"name\":\"" << queueName
            << "\"}},\n";
        m_TraceFile
            << "{\"ph\":\"M\",\"name\":\"thread_sort_index\",\"pid\":" << m_ProcessId
            << ",\"tid\":" << queueNumber
            << ".1,\"args\":{\"sort_index\":\"" << queueNumber
            << "\"}},\n";
    }